

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lest_cpp03.hpp
# Opt level: O3

result * __thiscall
lest::expression_lhs<lest::approx_const&>::operator!=
          (result *__return_storage_ptr__,expression_lhs<lest::approx_const&> *this,double *rhs)

{
  double dVar1;
  double dVar2;
  double dVar3;
  lest *this_00;
  double *in_R8;
  double dVar4;
  double dVar5;
  undefined1 *local_d8;
  long local_d0;
  undefined1 local_c8 [16];
  undefined1 *local_b8;
  long local_b0;
  undefined1 local_a8 [16];
  bool local_98;
  undefined1 *local_90;
  long local_88;
  undefined1 local_80 [16];
  approx local_70;
  string local_50;
  
  this_00 = *(lest **)this;
  dVar1 = *rhs;
  dVar2 = *(double *)(this_00 + 0x10);
  dVar4 = ABS(dVar1);
  dVar5 = ABS(dVar2);
  if (dVar4 <= dVar5) {
    dVar5 = dVar4;
  }
  dVar4 = *(double *)(this_00 + 8);
  dVar3 = *(double *)this_00;
  local_d8 = local_c8;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_d8,"!=","");
  local_70.epsilon_ = (double)&local_70.magnitude_;
  std::__cxx11::string::_M_construct<char*>((string *)&local_70,local_d8,local_d8 + local_d0);
  to_string<lest::approx,double>(&local_50,this_00,&local_70,(string *)rhs,in_R8);
  local_b8 = local_a8;
  std::__cxx11::string::_M_construct<char*>
            ((string *)&local_b8,local_50._M_dataplus._M_p,
             local_50._M_dataplus._M_p + local_50._M_string_length);
  local_98 = (dVar5 + dVar4) * dVar3 <= ABS(dVar1 - dVar2);
  local_90 = local_80;
  std::__cxx11::string::_M_construct<char*>((string *)&local_90,local_b8,local_b8 + local_b0);
  __return_storage_ptr__->passed = local_98;
  (__return_storage_ptr__->decomposition)._M_dataplus._M_p =
       (pointer)&(__return_storage_ptr__->decomposition).field_2;
  std::__cxx11::string::_M_construct<char*>
            ((string *)&__return_storage_ptr__->decomposition,local_90,local_90 + local_88);
  if (local_90 != local_80) {
    operator_delete(local_90);
  }
  if (local_b8 != local_a8) {
    operator_delete(local_b8);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_50._M_dataplus._M_p != &local_50.field_2) {
    operator_delete(local_50._M_dataplus._M_p);
  }
  if ((double *)local_70.epsilon_ != &local_70.magnitude_) {
    operator_delete((void *)local_70.epsilon_);
  }
  if (local_d8 != local_c8) {
    operator_delete(local_d8);
  }
  return __return_storage_ptr__;
}

Assistant:

result operator< ( R const & rhs ) { return result( lhs <  rhs, to_string( lhs, "<" , rhs ) ); }